

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.hpp
# Opt level: O0

int __thiscall optimization::inlineFunc::Inline_Func::init(Inline_Func *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  __type_conflict _Var2;
  int iVar3;
  undefined7 extraout_var;
  pointer ppVar4;
  pointer pIVar5;
  type pIVar6;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar7;
  CallInst *callInst;
  Inst *iptr;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  iterator __end4;
  iterator __begin4;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range4;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *insts;
  pair<const_int,_mir::inst::BasicBlk> *blkpair;
  iterator __end3;
  iterator __begin3;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *__range3;
  bool flag;
  iterator iter;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff28;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  *in_stack_ffffffffffffff30;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
  *in_stack_ffffffffffffff38;
  value_type *in_stack_ffffffffffffff48;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_70;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *local_68;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *local_60;
  _Base_ptr local_58;
  undefined1 local_50;
  reference local_48;
  _Self local_40;
  _Self local_38;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *local_30;
  byte local_21;
  _Self local_20;
  _Self local_18;
  EVP_PKEY_CTX *local_10;
  Inline_Func *local_8;
  
  local_10 = ctx;
  local_8 = this;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                *)in_stack_ffffffffffffff28);
  do {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                *)in_stack_ffffffffffffff28);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) {
      return (int)CONCAT71(extraout_var,bVar1);
    }
    local_21 = 0;
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                           *)0x155739);
    local_30 = &(ppVar4->second).basic_blks;
    local_38._M_node =
         (_Base_ptr)
         std::
         map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
         ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  *)in_stack_ffffffffffffff28);
    local_40._M_node =
         (_Base_ptr)
         std::
         map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
         ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                *)in_stack_ffffffffffffff28);
    while (bVar1 = std::operator!=(&local_38,&local_40), bVar1) {
      local_48 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator*
                           ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                            0x15579e);
      if ((local_48->second).jump.jump_kind == Loop) {
        local_21 = 1;
        in_stack_ffffffffffffff48 = (value_type *)&this->uninlineable_funcs;
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                      *)0x1557da);
        pVar7 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)this,in_stack_ffffffffffffff48);
        local_58 = (_Base_ptr)pVar7.first._M_node;
        local_50 = pVar7.second;
        break;
      }
      local_68 = &(local_48->second).inst;
      local_60 = local_68;
      local_70._M_current =
           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
           std::
           vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                    *)in_stack_ffffffffffffff28);
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             *)in_stack_ffffffffffffff28);
      while (bVar1 = __gnu_cxx::operator!=
                               (in_stack_ffffffffffffff30,
                                (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                 *)in_stack_ffffffffffffff28), bVar1) {
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
        ::operator*(&local_70);
        pIVar5 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                           ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            0x155869);
        iVar3 = (*(pIVar5->super_Displayable)._vptr_Displayable[1])();
        if (iVar3 == 6) {
          pIVar6 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                   operator*((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                             in_stack_ffffffffffffff30);
          if (pIVar6 == (type)0x0) {
            in_stack_ffffffffffffff38 =
                 (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                  *)0x0;
          }
          else {
            in_stack_ffffffffffffff38 =
                 (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                  *)__dynamic_cast(pIVar6,&mir::inst::Inst::typeinfo,&mir::inst::CallInst::typeinfo,
                                   0);
          }
          in_stack_ffffffffffffff30 =
               (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                *)(in_stack_ffffffffffffff38 + 3);
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
          ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                        *)0x1558ec);
          _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)this,in_stack_ffffffffffffff48);
          if (_Var2) {
            in_stack_ffffffffffffff28 = &this->uninlineable_funcs;
            std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
            ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                          *)0x155919);
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this,in_stack_ffffffffffffff48);
            local_21 = 1;
            break;
          }
        }
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
        ::operator++(&local_70);
      }
      if ((local_21 & 1) != 0) break;
      std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                 in_stack_ffffffffffffff30);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
    ::operator++(in_stack_ffffffffffffff38,(int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
  } while( true );
}

Assistant:

void init(mir::inst::MirPackage& package) {
    for (auto iter = package.functions.begin(); iter != package.functions.end();
         iter++) {
      bool flag = false;
      for (auto& blkpair : iter->second.basic_blks) {
        if (blkpair.second.jump.jump_kind == mir::inst::JumpKind::Loop) {
          flag = true;
          uninlineable_funcs.insert(iter->first);
          break;
        }
        auto& insts = blkpair.second.inst;
        for (auto& inst : insts) {
          if (inst->inst_kind() != mir::inst::InstKind::Call) {
            continue;
          }
          auto& iptr = *inst;
          auto callInst = dynamic_cast<mir::inst::CallInst*>(&iptr);
          if (callInst->func == iter->first) {
            uninlineable_funcs.insert(iter->first);
            flag = true;
            break;
          }
        }
        if (flag) {
          break;
        }
      }
    }
  }